

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall chrono::ChBody::VariablesQbIncrementPosition(ChBody *this,double dt_step)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  undefined1 auVar9 [32];
  double dVar10;
  double dVar11;
  undefined8 in_XMM0_Qb;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  ChQuaternion<double> q;
  ChVector<double> newspeed;
  ChVector<double> newwel;
  ChQuaternion<double> local_160;
  undefined8 local_140;
  double local_130;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  double dStack_f0;
  undefined1 local_e8 [32];
  ChVector<double> local_c8;
  ChVector<double> local_b0;
  undefined1 local_98 [16];
  double dStack_88;
  double dStack_80;
  undefined1 local_78 [32];
  double local_58;
  double dStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 local_38 [24];
  undefined1 auVar23 [32];
  
  local_e8._8_8_ = in_XMM0_Qb;
  local_e8._0_8_ = dt_step;
  iVar8 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar8 == '\0') {
    return;
  }
  ChVariables::Get_qb((ChVectorRef *)&local_b0,(ChVariables *)&this->variables);
  local_160.m_data[1] = 1.48219693752374e-323;
  local_160.m_data[0] = local_b0.m_data[0];
  local_160.m_data[3] = (double)&local_b0;
  local_140 = 0;
  local_130 = local_b0.m_data[1];
  if (2 < (long)local_b0.m_data[1]) {
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_c8,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_160,(type *)0x0);
    ChVariables::Get_qb((ChVectorRef *)local_38,(ChVariables *)&this->variables);
    local_160.m_data[1] = 1.48219693752374e-323;
    local_160.m_data[0] = (double)(local_38._0_8_ + 0x18);
    local_160.m_data[3] = (double)local_38;
    local_140 = 3;
    local_130 = (double)local_38._8_8_;
    if (5 < (long)local_38._8_8_) {
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_b0,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_160,(type *)0x0);
      dVar10 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos
               .m_data[2];
      dVar11 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos
               .m_data[1];
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data
      [0] = (double)local_e8._0_8_ * local_c8.m_data[0] +
            (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
            m_data[0];
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data
      [1] = (double)local_e8._0_8_ * local_c8.m_data[1] + dVar11;
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data
      [2] = (double)local_e8._0_8_ * local_c8.m_data[2] + dVar10;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_b0.m_data[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_b0.m_data[2];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[3];
      auVar25._8_8_ = 0;
      auVar25._0_8_ =
           local_b0.m_data[1] *
           (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar1 = vfmadd231sd_fma(auVar25,auVar12,auVar1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar18._8_8_ = 0;
      auVar18._0_8_ =
           local_b0.m_data[1] *
           (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar2 = vfmadd231sd_fma(auVar18,auVar12,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
      auVar15._8_8_ = 0;
      auVar15._0_8_ =
           local_b0.m_data[1] *
           (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      auVar3 = vfmadd231sd_fma(auVar15,auVar12,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[5];
      auVar1 = vfmadd231sd_fma(auVar1,auVar21,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar2 = vfmadd231sd_fma(auVar2,auVar21,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar3 = vfmadd231sd_fma(auVar3,auVar21,auVar6);
      dVar24 = auVar1._0_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar24 * dVar24;
      auVar1 = vfmadd231sd_fma(auVar13,auVar2,auVar2);
      auVar1 = vfmadd231sd_fma(auVar1,auVar3,auVar3);
      auVar1 = vsqrtsd_avx(auVar1,auVar1);
      dVar10 = auVar1._0_8_;
      bVar7 = 2.2250738585072014e-308 <= dVar10;
      dVar11 = 1.0 / dVar10;
      local_128 = (double)((ulong)bVar7 * (long)(auVar2._0_8_ * dVar11) +
                          (ulong)!bVar7 * 0x3ff0000000000000);
      local_108 = (double)((ulong)bVar7 * (long)(dVar24 * dVar11));
      local_118 = (double)((ulong)bVar7 * (long)(auVar3._0_8_ * dVar11));
      uStack_110 = 0;
      local_78 = *(undefined1 (*) [32])
                  (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
                  rot.m_data;
      uStack_100 = 0;
      dVar10 = dVar10 * (double)local_e8._0_8_ * 0.5;
      uStack_120 = 0;
      _local_98 = vpermpd_avx2(local_78,1);
      local_e8 = vpermpd_avx2(*(undefined1 (*) [32])
                               ((this->super_ChBodyFrame).super_ChFrameMoving<double>.
                                super_ChFrame<double>.coord.rot.m_data + 2),0x15);
      local_f8 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
                 rot.m_data[1];
      local_58 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
                 rot.m_data[2];
      uStack_48 = 0;
      uStack_40 = 0;
      dStack_f0 = local_f8;
      dStack_50 = local_58;
      dVar11 = sin(dVar10);
      auVar14._0_8_ = cos(dVar10);
      auVar14._8_8_ = auVar14._0_8_;
      auVar14._16_8_ = auVar14._0_8_;
      auVar14._24_8_ = auVar14._0_8_;
      dVar10 = dVar11 * local_118;
      auVar27._0_8_ = -(dVar11 * local_128);
      auVar27._8_8_ = 0x8000000000000000;
      auVar22._8_8_ = dVar10;
      auVar22._0_8_ = dVar10;
      auVar23._16_8_ = dVar10;
      auVar23._0_16_ = auVar22;
      auVar23._24_8_ = dVar10;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar11 * local_128;
      auVar1 = vunpcklpd_avx(auVar27,auVar16);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar11 * local_108;
      auVar17._16_8_ = dVar11 * local_108;
      auVar17._0_16_ = auVar1;
      auVar17._24_8_ = 0;
      auVar1 = vunpcklpd_avx(auVar19,auVar22);
      auVar26._8_8_ = dStack_50;
      auVar26._0_8_ = local_58;
      auVar9 = vblendpd_avx(auVar17,auVar23,8);
      auVar28._0_8_ = auVar9._0_8_ * (double)local_98._0_8_;
      auVar28._8_8_ = auVar9._8_8_ * (double)local_98._8_8_;
      auVar28._16_8_ = auVar9._16_8_ * dStack_88;
      auVar28._24_8_ = auVar9._24_8_ * dStack_80;
      auVar26._24_8_ = dStack_f0;
      auVar26._16_8_ = local_f8;
      auVar20 = ZEXT1632(CONCAT88(auVar1._8_8_ ^ 0x8000000000000000,
                                  auVar1._0_8_ ^ 0x8000000000000000));
      auVar9 = vblendpd_avx(auVar20,auVar23,4);
      auVar9 = vpermpd_avx2(auVar9,0x24);
      auVar1 = vfmadd132pd_fma(auVar14,auVar28,local_78);
      auVar1 = vfmadd213pd_fma(auVar26,auVar9,ZEXT1632(auVar1));
      auVar9 = vpermi2pd_avx512vl(_DAT_009553a0,auVar17,auVar20);
      auVar1 = vfmadd132pd_fma(auVar9,ZEXT1632(auVar1),local_e8);
      local_160.m_data = (double  [4])ZEXT1632(auVar1);
      ChFrame<double>::SetRot((ChFrame<double> *)&this->super_ChBodyFrame,&local_160);
      return;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChBody::VariablesQbIncrementPosition(double dt_step) {
    if (!this->IsActive())
        return;

    // Updates position with incremental action of speed contained in the
    // 'qb' vector:  pos' = pos + dt * speed   , like in an Eulero step.

    ChVector<> newspeed(variables.Get_qb().segment(0, 3));
    ChVector<> newwel(variables.Get_qb().segment(3, 3));

    // ADVANCE POSITION: pos' = pos + dt * vel
    this->SetPos(this->GetPos() + newspeed * dt_step);

    // ADVANCE ROTATION: rot' = [dt*wwel]%rot  (use quaternion for delta rotation)
    ChQuaternion<> mdeltarot;
    ChQuaternion<> moldrot = this->GetRot();
    ChVector<> newwel_abs = Amatrix * newwel;
    double mangle = newwel_abs.Length() * dt_step;
    newwel_abs.Normalize();
    mdeltarot.Q_from_AngAxis(mangle, newwel_abs);
    ChQuaternion<> mnewrot = mdeltarot % moldrot;
    this->SetRot(mnewrot);
}